

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjpeg-idct.c
# Opt level: O1

void pjpeg_idct_2D_u32(int32_t *in,uint8_t *out,uint32_t outstride)

{
  int32_t *piVar1;
  int iVar2;
  int x;
  long lVar3;
  int iVar4;
  long lVar5;
  int32_t tmp2 [64];
  int32_t tmp [64];
  int32_t local_228 [64];
  int32_t aiStack_128 [66];
  
  piVar1 = local_228;
  lVar5 = 0;
  do {
    idct_1D_u32((int32_t *)((long)in + lVar5),1,(int32_t *)((long)aiStack_128 + lVar5),1);
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x100);
  lVar5 = 0;
  do {
    idct_1D_u32((int32_t *)((long)aiStack_128 + lVar5),8,(int32_t *)((long)local_228 + lVar5),8);
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x20);
  iVar2 = 0;
  lVar5 = 0;
  do {
    lVar3 = 0;
    do {
      iVar4 = *(int *)((long)piVar1 + lVar3 * 4) + 0x2020000 >> 0x12;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      if (0xfe < iVar4) {
        iVar4 = 0xff;
      }
      out[(uint)(iVar2 + (int)lVar3)] = (uint8_t)iVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    lVar5 = lVar5 + 1;
    iVar2 = iVar2 + outstride;
    piVar1 = (int32_t *)((long)piVar1 + 0x20);
  } while (lVar5 != 8);
  return;
}

Assistant:

void pjpeg_idct_2D_u32(int32_t in[64], uint8_t *out, uint32_t outstride)
{
    int32_t tmp[64];

    // idct on rows
    for (int y = 0; y < 8; y++)
        idct_1D_u32(&in[8*y], 1, &tmp[8*y], 1);

    int32_t tmp2[64];

    // idct on columns
    for (int x = 0; x < 8; x++)
        idct_1D_u32(&tmp[x], 8, &tmp2[x], 8);

    // scale, adjust bias, and clamp
    for (int y = 0; y < 8; y++) {
        for (int x = 0; x < 8; x++) {
            int i = 8*y + x;

            // Shift of 18: the divide by 4 as part of the idct, and a shift by 16
            // to undo the fixed-point arithmetic. (We accumulated 8 bits of
            // fractional precision during each of the row and column IDCTs)
            //
            // Originally:
            //            int32_t v = (tmp2[i] >> 18) + 128;
            //
            // Move the add before the shift and we can do rounding at
            // the same time.
            const int32_t offset = (128 << 18) + (1 << 17);
            int32_t v = (tmp2[i] + offset) >> 18;

            if (v < 0)
                v = 0;
            if (v > 255)
                v = 255;

            out[y*outstride + x] = v;
        }
    }
}